

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# e_afalg.c
# Opt level: O0

int afalg_fin_cipher_aio(afalg_aio *aio,int sfd,uchar *buf,size_t len)

{
  bool bVar1;
  int iVar2;
  ssize_t sVar3;
  int *piVar4;
  uint uVar5;
  undefined8 in_RCX;
  undefined8 in_RDX;
  int in_ESI;
  int *in_RDI;
  u_int64_t eval;
  io_event events [1];
  timespec timeout;
  iocb *cb;
  uint done;
  int retry;
  int r;
  io_event *in_stack_ffffffffffffff78;
  aio_context_t ctx;
  long in_stack_ffffffffffffff88;
  aio_context_t in_stack_ffffffffffffff90;
  afalg_aio *in_stack_ffffffffffffff98;
  uint local_30;
  int local_4;
  
  local_30 = 0;
  bVar1 = false;
  ctx = 0;
  if ((in_RDI[1] == 0) &&
     (iVar2 = afalg_setup_async_event_notification(in_stack_ffffffffffffff98), iVar2 == 0)) {
    local_4 = 0;
  }
  else {
    piVar4 = in_RDI + 0xc;
    memset(piVar4,0,0x40);
    in_RDI[0x11] = in_ESI;
    *(undefined2 *)(in_RDI + 0x10) = 0;
    *(undefined8 *)(in_RDI + 0x12) = in_RDX;
    in_RDI[0x16] = 0;
    in_RDI[0x17] = 0;
    piVar4[0] = 0;
    piVar4[1] = 0;
    *(undefined8 *)(in_RDI + 0x14) = in_RCX;
    in_RDI[0x1a] = 1;
    in_RDI[0x1b] = *in_RDI;
    iVar2 = io_read(ctx,(long)in_stack_ffffffffffffff78,(iocb **)0x2e44e5);
    if (iVar2 < 0) {
      fprintf(_stderr,"ALG_PERR: %s(%d): io_read failed : ","engines/e_afalg.c",0x132);
      perror((char *)0x0);
      local_4 = 0;
    }
    else {
      do {
        ASYNC_pause_job();
        sVar3 = read(*in_RDI,&stack0xffffffffffffff80,8);
        if ((int)sVar3 < 0) {
          piVar4 = __errno_location();
          if ((*piVar4 != 0xb) && (piVar4 = __errno_location(), *piVar4 != 0xb)) {
            fprintf(_stderr,"ALG_PERR: %s(%d): read failed for event fd : ","engines/e_afalg.c",
                    0x13f);
            perror((char *)0x0);
            return 0;
          }
        }
        else if (ctx != 0) {
          iVar2 = io_getevents(in_stack_ffffffffffffff90,in_stack_ffffffffffffff88,ctx,
                               in_stack_ffffffffffffff78,(timespec *)0x2e45ee);
          if (iVar2 < 1) {
            if (iVar2 < 0) {
              fprintf(_stderr,"ALG_PERR: %s(%d): io_getevents failed : ","engines/e_afalg.c",0x173);
              perror((char *)0x0);
              return 0;
            }
          }
          else if ((long)in_stack_ffffffffffffff98 < 0) {
            if ((in_stack_ffffffffffffff98 != (afalg_aio *)0xfffffffffffffff0) ||
               (uVar5 = local_30 + 1, 2 < (int)local_30)) {
              return 0;
            }
            iVar2 = io_read(ctx,(long)in_stack_ffffffffffffff78,(iocb **)0x2e463b);
            local_30 = uVar5;
            if (iVar2 < 0) {
              fprintf(_stderr,"ALG_PERR: %s(%d): retry %d for io_read failed : ","engines/e_afalg.c"
                      ,0x161,(ulong)uVar5);
              perror((char *)0x0);
              return 0;
            }
          }
          else {
            bVar1 = true;
          }
        }
      } while (!bVar1);
      local_4 = 1;
    }
  }
  return local_4;
}

Assistant:

static int afalg_fin_cipher_aio(afalg_aio *aio, int sfd, unsigned char *buf,
                                size_t len)
{
    int r;
    int retry = 0;
    unsigned int done = 0;
    struct iocb *cb;
    struct timespec timeout;
    struct io_event events[MAX_INFLIGHTS];
    u_int64_t eval = 0;

    timeout.tv_sec = 0;
    timeout.tv_nsec = 0;

    /* if efd has not been initialised yet do it here */
    if (aio->mode == MODE_UNINIT) {
        r = afalg_setup_async_event_notification(aio);
        if (r == 0)
            return 0;
    }

    cb = &(aio->cbt[0 % MAX_INFLIGHTS]);
    memset(cb, '\0', sizeof(*cb));
    cb->aio_fildes = sfd;
    cb->aio_lio_opcode = IOCB_CMD_PREAD;
    /*
     * The pointer has to be converted to unsigned value first to avoid
     * sign extension on cast to 64 bit value in 32-bit builds
     */
    cb->aio_buf = (size_t)buf;
    cb->aio_offset = 0;
    cb->aio_data = 0;
    cb->aio_nbytes = len;
    cb->aio_flags = IOCB_FLAG_RESFD;
    cb->aio_resfd = aio->efd;

    /*
     * Perform AIO read on AFALG socket, this in turn performs an async
     * crypto operation in kernel space
     */
    r = io_read(aio->aio_ctx, 1, &cb);
    if (r < 0) {
        ALG_PWARN("%s(%d): io_read failed : ", __FILE__, __LINE__);
        return 0;
    }

    do {
        /* While AIO read is being performed pause job */
        ASYNC_pause_job();

        /* Check for completion of AIO read */
        r = read(aio->efd, &eval, sizeof(eval));
        if (r < 0) {
            if (errno == EAGAIN || errno == EWOULDBLOCK)
                continue;
            ALG_PERR("%s(%d): read failed for event fd : ", __FILE__, __LINE__);
            return 0;
        } else if (r == 0 || eval <= 0) {
            ALG_WARN("%s(%d): eventfd read %d bytes, eval = %lu\n", __FILE__,
                     __LINE__, r, eval);
        }
        if (eval > 0) {

#ifdef OSSL_SANITIZE_MEMORY
            /*
             * In a memory sanitiser build, the changes to memory made by the
             * system call aren't reliably detected.  By initialising the
             * memory here, the sanitiser is told that they are okay.
             */
            memset(events, 0, sizeof(events));
#endif

            /* Get results of AIO read */
            r = io_getevents(aio->aio_ctx, 1, MAX_INFLIGHTS,
                             events, &timeout);
            if (r > 0) {
                /*
                 * events.res indicates the actual status of the operation.
                 * Handle the error condition first.
                 */
                if (events[0].res < 0) {
                    /*
                     * Underlying operation cannot be completed at the time
                     * of previous submission. Resubmit for the operation.
                     */
                    if (events[0].res == -EBUSY && retry++ < 3) {
                        r = io_read(aio->aio_ctx, 1, &cb);
                        if (r < 0) {
                            ALG_PERR("%s(%d): retry %d for io_read failed : ",
                                     __FILE__, __LINE__, retry);
                            return 0;
                        }
                        continue;
                    } else {
                        /*
                         * Retries exceed for -EBUSY or unrecoverable error
                         * condition for this instance of operation.
                         */
                        ALG_WARN
                            ("%s(%d): Crypto Operation failed with code %lld\n",
                             __FILE__, __LINE__, events[0].res);
                        return 0;
                    }
                }
                /* Operation successful. */
                done = 1;
            } else if (r < 0) {
                ALG_PERR("%s(%d): io_getevents failed : ", __FILE__, __LINE__);
                return 0;
            } else {
                ALG_WARN("%s(%d): io_geteventd read 0 bytes\n", __FILE__,
                         __LINE__);
            }
        }
    } while (!done);

    return 1;
}